

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

int __thiscall CVmDynFuncVMIfc::validate_obj(CVmDynFuncVMIfc *this,tctarg_obj_id_t obj)

{
  int iVar1;
  undefined8 in_RDI;
  CVmObjTable *unaff_retaddr;
  
  iVar1 = CVmObjTable::is_obj_id_valid(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
  return iVar1;
}

Assistant:

virtual int validate_obj(tctarg_obj_id_t obj)
    {
        VMGLOB_PTR(vmg);
        return G_obj_table->is_obj_id_valid(obj);
    }